

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receiver.hpp
# Opt level: O0

Sender<std::vector<std::__cxx11::basic_string<char>_>_> __thiscall
ftxui::
ReceiverImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::MakeSender(ReceiverImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *this)

{
  SenderImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  ReceiverImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RSI;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  ReceiverImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_local;
  
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&in_RSI->mutex_);
  std::__atomic_base<int>::operator++(&(in_RSI->senders_).super___atomic_base<int>,0);
  this_00 = (SenderImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)operator_new(8);
  SenderImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::SenderImpl(this_00,in_RSI);
  std::
  unique_ptr<ftxui::SenderImpl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::default_delete<ftxui::SenderImpl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
  ::
  unique_ptr<std::default_delete<ftxui::SenderImpl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,void>
            ((unique_ptr<ftxui::SenderImpl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::default_delete<ftxui::SenderImpl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              *)this,this_00);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return (__uniq_ptr_data<ftxui::SenderImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::default_delete<ftxui::SenderImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_true,_true>
          )(__uniq_ptr_data<ftxui::SenderImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::default_delete<ftxui::SenderImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_true,_true>
            )this;
}

Assistant:

Sender<T> MakeSender() {
    std::unique_lock<std::mutex> lock(mutex_);
    senders_++;
    return std::unique_ptr<SenderImpl<T>>(new SenderImpl<T>(this));
  }